

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

void Acb_NtkCreateFanout(Acb_Ntk_t *p)

{
  Acb_ObjType_t AVar1;
  int iVar2;
  
  iVar2 = (p->vObjType).nCap;
  Vec_WecGrow(&p->vFanouts,iVar2);
  (p->vFanouts).nSize = iVar2;
  for (iVar2 = 1; iVar2 < (p->vObjType).nSize; iVar2 = iVar2 + 1) {
    AVar1 = Acb_ObjType(p,iVar2);
    if (AVar1 != ABC_OPER_NONE) {
      Acb_ObjAddFaninFanout(p,iVar2);
    }
  }
  return;
}

Assistant:

static inline void Acb_NtkCreateFanout( Acb_Ntk_t * p )
{
    int iObj; 
    Acb_NtkCleanObjFanout( p );
    Acb_NtkForEachObj( p, iObj )
        Acb_ObjAddFaninFanout( p, iObj );
}